

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::OutputTestResult(JunitReporter *this,XmlWriter *xml,TestCaseStats *stats)

{
  pointer pTVar1;
  bool bVar2;
  string *attribute;
  allocator local_59;
  ScopedElement e;
  string local_50;
  
  pTVar1 = (stats->m_testStats).
           super__Vector_base<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (attribute = &((stats->m_testStats).
                     super__Vector_base<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_message;
      (pointer)(attribute + -2) != pTVar1; attribute = attribute + 4) {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (attribute + -2),"success");
    if (bVar2) {
      XmlWriter::scopedElement((XmlWriter *)&e,(string *)xml);
      std::__cxx11::string::string((string *)&local_50,"message",&local_59);
      XmlWriter::writeAttribute(xml,&local_50,attribute);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"type",&local_59);
      XmlWriter::writeAttribute(xml,&local_50,attribute + -1);
      std::__cxx11::string::~string((string *)&local_50);
      if (attribute[1]._M_string_length != 0) {
        XmlWriter::writeText(xml,attribute + 1,true);
      }
      XmlWriter::ScopedElement::~ScopedElement(&e);
    }
  }
  return;
}

Assistant:

void OutputTestResult( XmlWriter& xml, const TestCaseStats& stats ) {
            std::vector<TestStats>::const_iterator it = stats.m_testStats.begin();
            std::vector<TestStats>::const_iterator itEnd = stats.m_testStats.end();
            for(; it != itEnd; ++it ) {
                if( it->m_element != "success" ) {
                    XmlWriter::ScopedElement e = xml.scopedElement( it->m_element );

                    xml.writeAttribute( "message", it->m_message );
                    xml.writeAttribute( "type", it->m_resultType );
                    if( !it->m_content.empty() )
                        xml.writeText( it->m_content );
                }
            }
        }